

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_chroma_intra_pred_filters.c
# Opt level: O0

void ihevc_intra_pred_chroma_mode_18_34
               (UWORD8 *pu1_ref,WORD32 src_strd,UWORD8 *pu1_dst,WORD32 dst_strd,WORD32 nt,
               WORD32 mode)

{
  int iVar1;
  WORD32 idx;
  WORD32 intra_pred_ang;
  WORD32 col;
  WORD32 row;
  WORD32 mode_local;
  WORD32 nt_local;
  WORD32 dst_strd_local;
  UWORD8 *pu1_dst_local;
  WORD32 src_strd_local;
  UWORD8 *pu1_ref_local;
  
  if (mode == 0x12) {
    intra_pred_ang = -0x20;
  }
  else {
    intra_pred_ang = 0x20;
  }
  for (row = 0; row < nt; row = row + 1) {
    iVar1 = (row + 1) * intra_pred_ang >> 5;
    for (col = 0; SBORROW4(col,nt * 2) != col + nt * -2 < 0; col = col + 2) {
      pu1_dst[col + row * dst_strd] = pu1_ref[nt * 4 + col + iVar1 * 2 + 2];
      pu1_dst[col + 1 + row * dst_strd] = pu1_ref[nt * 4 + col + iVar1 * 2 + 3];
    }
  }
  return;
}

Assistant:

void ihevc_intra_pred_chroma_mode_18_34(UWORD8 *pu1_ref,
                                        WORD32 src_strd,
                                        UWORD8 *pu1_dst,
                                        WORD32 dst_strd,
                                        WORD32 nt,
                                        WORD32 mode)
{
    WORD32 row, col;
    WORD32 intra_pred_ang;
    WORD32 idx = 0;
    UNUSED(src_strd);
    intra_pred_ang = 32; /*Default value*/
    /* For mode 18, angle is -45degree */
    if(mode == 18)
        intra_pred_ang = -32;
    /* For mode 34, angle is 45degree */
    else if(mode == 34)
        intra_pred_ang = 32;
    /* For the angle 45 and -45, replication is done from the corresponding angle */
    /* No interpolation is done for 45 degree*/
    for(row = 0; row < nt; row++)
    {
        idx = ((row + 1) * intra_pred_ang) >> 5;

        for(col = 0; col < (2 * nt); col += 2)
        {
            pu1_dst[col + (row * dst_strd)] = pu1_ref[(4 * nt) + col + 2 * idx + 2];
            pu1_dst[(col + 1) + (row * dst_strd)] = pu1_ref[(4 * nt) + (col + 1) + 2 * idx + 2];
        }

    }

}